

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isConformantSchemeName(XMLCh *scheme,XMLSize_t schemeLen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  
  bVar1 = XMLString::isAlpha(*scheme);
  if (bVar1) {
    bVar1 = schemeLen < 2;
    if (!bVar1) {
      uVar4 = 2;
      do {
        bVar2 = XMLString::isAlphaNum(scheme[uVar4 - 1]);
        if ((!bVar2) && (iVar3 = XMLString::indexOf(L"+-.",scheme[uVar4 - 1]), iVar3 == -1)) {
          return bVar1;
        }
        bVar1 = schemeLen <= uVar4;
        bVar2 = uVar4 != schemeLen;
        uVar4 = uVar4 + 1;
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool XMLUri::isConformantSchemeName( const XMLCh* const scheme
                                   , const XMLSize_t schemeLen)
{
    if (!XMLString::isAlpha(*scheme))     // first: alpha
        return false;

    // second onwards: ( alpha | digit | "+" | "-" | "." )
    for (XMLSize_t i=1; i<schemeLen; i++)
    {
        if ( !XMLString::isAlphaNum(scheme[i]) &&
             (XMLString::indexOf(SCHEME_CHARACTERS, scheme[i]) == -1))
            return false;
    }

    return true;
}